

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

Generator * kratos::MergeWireAssignmentsVisitor::get_parent(StmtBlock *block)

{
  int iVar1;
  undefined4 extraout_var;
  Generator *pGVar3;
  StmtException *this;
  int iVar4;
  initializer_list<kratos::IRNode_*> __l;
  string local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  StmtBlock *local_30;
  allocator<char> local_22;
  allocator_type local_21;
  StmtBlock *pSVar2;
  
  iVar4 = 0x2711;
  pSVar2 = block;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) goto LAB_00204cbf;
    iVar1 = (*(pSVar2->super_Stmt).super_IRNode._vptr_IRNode[4])(pSVar2);
    pSVar2 = (StmtBlock *)CONCAT44(extraout_var,iVar1);
  } while ((pSVar2->super_Stmt).super_IRNode.ast_node_type_ != GeneratorKind);
  pGVar3 = (Generator *)__dynamic_cast(pSVar2,&IRNode::typeinfo,&Generator::typeinfo,0);
  if (pGVar3 != (Generator *)0x0) {
    return pGVar3;
  }
LAB_00204cbf:
  this = (StmtException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Cannot find parent for the statement block",&local_22);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_30;
  local_30 = block;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_21);
  StmtException::StmtException(this,&local_68,&local_48);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Generator* get_parent(StmtBlock* block) {
        Generator* result = nullptr;
        IRNode* node = block;
        for (uint32_t i = 0; i < 10000u; i++) {
            auto* p = node->parent();
            if (p->ir_node_kind() == IRNodeKind::GeneratorKind) {
                result = dynamic_cast<Generator*>(p);
                break;
            }
            node = p;
        }
        if (!result) {
            throw StmtException("Cannot find parent for the statement block", {block});
        }
        return result;
    }